

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapePrism>::InitMaterialData
          (TPZCompElHCurl<pzshape::TPZShapePrism> *this,TPZMaterialData *data)

{
  TPZManVector<int,_27> *connectorders;
  int iVar1;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar2;
  double *pdVar3;
  int i;
  long lVar4;
  TPZVec<long> local_80;
  long alStack_60 [6];
  
  TPZInterpolationSpace::InitMaterialData((TPZInterpolationSpace *)this,data);
  (data->super_TPZShapeData).fShapeType = EVecShape;
  TPZVec<long>::TPZVec(&local_80,0);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b5098;
  local_80.fNElements = 6;
  local_80.fNAlloc = 0;
  alStack_60[0] = 0;
  alStack_60[1] = 0;
  alStack_60[2] = 0;
  alStack_60[3] = 0;
  alStack_60[4] = 0;
  alStack_60[5] = 0;
  local_80.fStore = alStack_60;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  lVar4 = 0;
  do {
    pTVar2 = TPZGeoEl::NodePtr(this_00,(int)lVar4);
    local_80.fStore[lVar4] = (long)pTVar2->fId;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  connectorders = &(data->super_TPZShapeData).fHDivConnectOrders;
  (*(data->super_TPZShapeData).fHDivConnectOrders.super_TPZVec<int>._vptr_TPZVec[2])
            (connectorders,0xf);
  lVar4 = 0;
  do {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x338))(this,(int)lVar4 + 6);
    (data->super_TPZShapeData).fHDivConnectOrders.super_TPZVec<int>.fStore[lVar4] = iVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xf);
  if (this->fhcurlfam == EHCurlStandard) {
    TPZShapeHCurl<pzshape::TPZShapePrism>::Initialize
              (&local_80,&connectorders->super_TPZVec<int>,&data->super_TPZShapeData);
  }
  else if (this->fhcurlfam == EHCurlNoGrads) {
    TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Initialize
              (&local_80,&connectorders->super_TPZVec<int>,&data->super_TPZShapeData);
  }
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))(this);
  (*(data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xe])(&data->phi,(long)iVar1,3);
  (*(data->curlphi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xe])(&data->curlphi,3,(long)iVar1);
  if ((data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
      (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 9) {
    pdVar3 = (data->axes).super_TPZFMatrix<double>.fElem;
    if ((pdVar3 != (double *)0x0) && (pdVar3 != (data->axes).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar3);
    }
    pdVar3 = (data->axes).super_TPZFMatrix<double>.fGiven;
    if ((pdVar3 == (double *)0x0) || ((data->axes).super_TPZFMatrix<double>.fSize < 9)) {
      pdVar3 = (double *)operator_new__(0x48);
    }
    (data->axes).super_TPZFMatrix<double>.fElem = pdVar3;
  }
  (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  (*(data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->axes);
  if ((data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
      (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow !=
      9) {
    pdVar3 = (data->jacobian).super_TPZFMatrix<double>.fElem;
    if ((pdVar3 != (double *)0x0) && (pdVar3 != (data->jacobian).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar3);
    }
    pdVar3 = (data->jacobian).super_TPZFMatrix<double>.fGiven;
    if ((pdVar3 == (double *)0x0) || ((data->jacobian).super_TPZFMatrix<double>.fSize < 9)) {
      pdVar3 = (double *)operator_new__(0x48);
    }
    (data->jacobian).super_TPZFMatrix<double>.fElem = pdVar3;
  }
  (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  (*(data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->jacobian);
  if ((data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
      (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 9)
  {
    pdVar3 = (data->jacinv).super_TPZFMatrix<double>.fElem;
    if ((pdVar3 != (double *)0x0) && (pdVar3 != (data->jacinv).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar3);
    }
    pdVar3 = (data->jacinv).super_TPZFMatrix<double>.fGiven;
    if ((pdVar3 == (double *)0x0) || ((data->jacinv).super_TPZFMatrix<double>.fSize < 9)) {
      pdVar3 = (double *)operator_new__(0x48);
    }
    (data->jacinv).super_TPZFMatrix<double>.fElem = pdVar3;
  }
  (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  (*(data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->jacinv);
  TPZManVector<double,_3>::Resize(&data->x,3);
  if (local_80.fStore == alStack_60) {
    local_80.fStore = (long *)0x0;
  }
  local_80.fNAlloc = 0;
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_80.fStore != (long *)0x0) {
    operator_delete__(local_80.fStore);
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::InitMaterialData(TPZMaterialData &data){
	TPZIntelGen<TSHAPE>::InitMaterialData(data);
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHCurl")
    }
#endif
    data.fShapeType = TPZMaterialData::MShapeFunctionType::EVecShape;
    TPZShapeData & shapedata = data;

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes,0);
    TPZGeoEl *ref = this->Reference();
    for(auto i=0; i<TSHAPE::NCornerNodes; i++) {
        ids[i] = ref->NodePtr(i)->Id();
    }
    
    auto &conOrders = shapedata.fHDivConnectOrders;
    constexpr auto nConnects = TSHAPE::NSides - TSHAPE::NCornerNodes;
    conOrders.Resize(nConnects,-1);
    for(auto i = 0; i < nConnects; i++){
        conOrders[i] = this->EffectiveSideOrder(i + TSHAPE::NCornerNodes);
    }

    switch (fhcurlfam)
    {
    case HCurlFamily::EHCurlStandard:
        TPZShapeHCurl<TSHAPE>::Initialize(ids, conOrders, shapedata);
        break;
    case HCurlFamily::EHCurlNoGrads:
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, conOrders, shapedata);
        break;
    }/**there is no default case on purpose, because now the compiler
      will warn us if a new hcurl family is added*/
    

    //resizing of TPZMaterialData structures

    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nshape = this->NShapeF();
    
    auto &phi = data.phi;
    auto &curlphi = data.curlphi;
    
    phi.Redim(nshape,3);
    curlphi.Redim(curldim,nshape);
    
    data.axes.Redim(dim,3);
    data.jacobian.Redim(dim,dim);
    data.jacinv.Redim(dim,dim);
    data.x.Resize(3);
// #ifdef PZ_LOG
//     if(logger.isDebugEnabled()){
// 		std::stringstream sout;
// 		sout << "Vector/Shape indexes \n";
//         for (int i = 0; i < shapedata.fVecShapeIndex.size(); i++) {
//             sout << i << '|' << shapedata.fVecShapeIndex[i] << " ";
//         }
//         sout << std::endl;
// 		LOGPZ_DEBUG(logger,sout.str())
// 	}
// #endif

}